

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

DescriptorStringView __thiscall
google::protobuf::FieldDescriptor::PrintableNameForExtension_abi_cxx11_(FieldDescriptor *this)

{
  bool bVar1;
  Type TVar2;
  MessageOptions *this_00;
  Descriptor *pDVar3;
  Descriptor *pDVar4;
  bool bVar5;
  undefined8 local_30;
  bool is_message_set_extension;
  FieldDescriptor *this_local;
  
  bVar1 = is_extension(this);
  bVar5 = false;
  if (bVar1) {
    pDVar4 = containing_type(this);
    this_00 = Descriptor::options(pDVar4);
    bVar1 = MessageOptions::message_set_wire_format(this_00);
    bVar5 = false;
    if (bVar1) {
      TVar2 = type(this);
      bVar5 = false;
      if (TVar2 == TYPE_MESSAGE) {
        bVar1 = is_optional(this);
        bVar5 = false;
        if (bVar1) {
          pDVar4 = extension_scope(this);
          pDVar3 = message_type(this);
          bVar5 = pDVar4 == pDVar3;
        }
      }
    }
  }
  if (bVar5) {
    pDVar4 = message_type(this);
    local_30 = Descriptor::full_name_abi_cxx11_(pDVar4);
  }
  else {
    local_30 = full_name_abi_cxx11_(this);
  }
  return local_30;
}

Assistant:

internal::DescriptorStringView FieldDescriptor::PrintableNameForExtension()
    const {
  const bool is_message_set_extension =
      is_extension() &&
      containing_type()->options().message_set_wire_format() &&
      type() == FieldDescriptor::TYPE_MESSAGE && is_optional() &&
      extension_scope() == message_type();
  return is_message_set_extension ? message_type()->full_name() : full_name();
}